

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O3

Vec_Ptr_t * Gia_ManMultiProveAig(Aig_Man_t *p,Bmc_MulPar_t *pPars)

{
  uint uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int nTotalSize;
  int iVar4;
  uint uVar5;
  Vec_Int_t *vOutMap;
  int *piVar6;
  Vec_Ptr_t *vCexesOut;
  void **ppvVar7;
  Vec_Int_t *pVVar8;
  Aig_Man_t *pAVar9;
  char *pcVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  void **extraout_RDX;
  long lVar15;
  void **extraout_RDX_00;
  void **extraout_RDX_01;
  void **extraout_RDX_02;
  int iVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  timespec ts_2;
  Saig_ParBmc_t ParsBmc;
  Ssw_RarPars_t ParsSim;
  int local_16c;
  abctime local_148;
  timespec local_138;
  Saig_ParBmc_t local_128;
  Ssw_RarPars_t local_90;
  
  iVar3 = clock_gettime(3,(timespec *)&local_128);
  if (iVar3 < 0) {
    local_148 = -1;
  }
  else {
    local_148 = (long)local_128._8_8_ / 1000 + local_128._0_8_ * 1000000;
  }
  if (pPars->TimeOutGlo == 0) {
    lVar17 = 0;
    lVar13 = 0;
  }
  else {
    iVar3 = clock_gettime(3,(timespec *)&local_128);
    if (iVar3 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = (long)local_128._8_8_ / 1000 + local_128._0_8_ * 1000000;
    }
    lVar17 = (long)pPars->TimeOutGlo;
    lVar13 = lVar17 * 1000000 + lVar13;
  }
  iVar3 = p->nTruePos;
  uVar5 = pPars->TimeOutLoc;
  nTotalSize = p->vObjs->nSize - p->nDeleted;
  if ((pPars->fVerbose != 0) &&
     (printf("MultiProve parameters: Global timeout = %d sec.  Local timeout = %d sec.  Time increase = %d %%.\n"
             ,lVar17,(ulong)uVar5,(ulong)(uint)pPars->TimeOutInc), pPars->fVerbose != 0)) {
    printf("Gap timout = %d sec. Per-output timeout = %d msec. Use synthesis = %d. Dump final = %d. Verbose = %d.\n"
           ,(ulong)(uint)pPars->TimeOutGap,(ulong)(uint)pPars->TimePerOut,
           (ulong)(uint)pPars->fUseSyn,(ulong)(uint)pPars->fDumpFinal);
  }
  uVar1 = p->nTruePos;
  vOutMap = (Vec_Int_t *)malloc(0x10);
  uVar11 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar11 = uVar1;
  }
  vOutMap->nCap = uVar11;
  if (uVar11 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)(int)uVar11 << 2);
  }
  vOutMap->pArray = piVar6;
  vOutMap->nSize = uVar1;
  auVar2 = _DAT_0093d220;
  if (0 < (int)uVar1) {
    lVar17 = (ulong)uVar1 - 1;
    auVar18._8_4_ = (int)lVar17;
    auVar18._0_8_ = lVar17;
    auVar18._12_4_ = (int)((ulong)lVar17 >> 0x20);
    uVar14 = 0;
    auVar18 = auVar18 ^ _DAT_0093d220;
    auVar19 = _DAT_0093d210;
    do {
      auVar20 = auVar19 ^ auVar2;
      if ((bool)(~(auVar20._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar20._0_4_ ||
                  auVar18._4_4_ < auVar20._4_4_) & 1)) {
        piVar6[uVar14] = (int)uVar14;
      }
      if ((auVar20._12_4_ != auVar18._12_4_ || auVar20._8_4_ <= auVar18._8_4_) &&
          auVar20._12_4_ <= auVar18._12_4_) {
        piVar6[uVar14 + 1] = (int)uVar14 + 1;
      }
      uVar14 = uVar14 + 2;
      lVar17 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar17 + 2;
    } while ((uVar1 + 1 & 0xfffffffe) != uVar14);
  }
  vCexesOut = (Vec_Ptr_t *)malloc(0x10);
  uVar11 = 8;
  if (6 < uVar1 - 1) {
    uVar11 = uVar1;
  }
  vCexesOut->nCap = uVar11;
  if (uVar11 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((long)(int)uVar11 << 3);
  }
  vCexesOut->pArray = ppvVar7;
  vCexesOut->nSize = uVar1;
  memset(ppvVar7,0,(long)(int)uVar1 << 3);
  local_16c = 0;
  while( true ) {
    if ((long)vCexesOut->nSize < 1) {
      iVar16 = 0;
    }
    else {
      lVar17 = 0;
      iVar16 = 0;
      do {
        iVar16 = iVar16 + (uint)(vCexesOut->pArray[lVar17] == (void *)0x0);
        lVar17 = lVar17 + 1;
      } while (vCexesOut->nSize != lVar17);
    }
    Ssw_RarSetDefaultParams(&local_90);
    local_90.fSolveAll = 1;
    local_90.fNotVerbose = 1;
    local_90.fSilent = (int)(pPars->fVeryVerbose == 0);
    local_90.nRandSeed = (uint)(local_16c * 0x11) % 500;
    local_90.nWords = 5;
    local_90.TimeOut = uVar5;
    Ssw_RarSimulate(p,&local_90);
    if (p->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      pVVar8 = Gia_ManProcessOutputs(p->vSeqModelVec,vCexesOut,vOutMap);
      if (pVVar8->nSize == 0) goto LAB_005b80b1;
      pAVar9 = Saig_ManDupCones(p,pVVar8->pArray,pVVar8->nSize);
      if (pVVar8->pArray != (int *)0x0) {
        free(pVVar8->pArray);
      }
      free(pVVar8);
      Aig_ManStop(p);
      p = pAVar9;
    }
    if (pPars->fVerbose != 0) {
      Gia_ManMultiReport(p,"SIM",iVar3,nTotalSize,local_148);
    }
    if (lVar13 != 0) break;
LAB_005b7e55:
    Saig_ParBmcSetDefaultParams(&local_128);
    local_128.fSolveAll = 1;
    local_128.fNotVerbose = 1;
    local_128.fSilent = (int)(pPars->fVeryVerbose == 0);
    local_128.nTimeOutOne = pPars->TimePerOut;
    pAVar9 = p;
    local_128.nTimeOut = uVar5;
    Saig_ManBmcScalable(p,&local_128);
    ppvVar7 = extraout_RDX;
    if (pPars->fVeryVerbose != 0) {
      lVar17 = (long)p->vSeqModelVec->nSize;
      if (lVar17 < 1) {
        iVar4 = 0;
      }
      else {
        lVar15 = 0;
        iVar4 = 0;
        do {
          iVar4 = iVar4 + (uint)(p->vSeqModelVec->pArray[lVar15] == (void *)0x0);
          lVar15 = lVar15 + 1;
        } while (lVar17 != lVar15);
      }
      Abc_Print((int)pAVar9,"Some outputs are SAT (%d out of %d) after %d frames.\n",
                (ulong)(uint)(p->nTruePos - iVar4),(ulong)(uint)p->nTruePos,
                (ulong)(uint)local_128.iFrame);
      ppvVar7 = extraout_RDX_00;
    }
    if (p->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      pVVar8 = Gia_ManProcessOutputs(p->vSeqModelVec,vCexesOut,vOutMap);
      if (pVVar8->nSize == 0) goto LAB_005b80b1;
      pAVar9 = Saig_ManDupCones(p,pVVar8->pArray,pVVar8->nSize);
      if (pVVar8->pArray != (int *)0x0) {
        free(pVVar8->pArray);
      }
      free(pVVar8);
      Aig_ManStop(p);
      ppvVar7 = extraout_RDX_01;
      p = pAVar9;
    }
    if (pPars->fVerbose != 0) {
      Gia_ManMultiReport(p,"BMC",iVar3,nTotalSize,local_148);
      ppvVar7 = extraout_RDX_02;
    }
    if (lVar13 != 0) {
      iVar4 = clock_gettime(3,&local_138);
      if (iVar4 < 0) {
        ppvVar7 = (void **)0xffffffffffffffff;
      }
      else {
        ppvVar7 = (void **)(local_138.tv_nsec / 1000 + local_138.tv_sec * 1000000);
      }
      if (lVar13 < (long)(ppvVar7 + (long)(int)uVar5 * 0x1e848)) goto LAB_005b8094;
    }
    iVar4 = (int)ppvVar7;
    uVar1 = pPars->TimeOutGap;
    if ((uVar1 != 0) && ((int)uVar1 <= (int)uVar5)) {
      if ((long)vCexesOut->nSize < 1) {
        iVar12 = 0;
      }
      else {
        ppvVar7 = vCexesOut->pArray;
        lVar17 = 0;
        iVar12 = 0;
        do {
          iVar12 = iVar12 + (uint)(ppvVar7[lVar17] == (void *)0x0);
          lVar17 = lVar17 + 1;
        } while (vCexesOut->nSize != lVar17);
      }
      iVar4 = (int)ppvVar7;
      if (iVar16 == iVar12) {
        pcVar10 = "Gap timeout (%d sec) is reached.\n";
        goto LAB_005b80a7;
      }
    }
    if (pPars->fUseSyn != 0) {
      pAVar9 = Gia_ManMultiProveSyn(p,uVar1,iVar4);
      Aig_ManStop(p);
      p = pAVar9;
      if (pPars->fVerbose != 0) {
        Gia_ManMultiReport(pAVar9,"SYN",iVar3,nTotalSize,local_148);
      }
    }
    uVar5 = (int)(pPars->TimeOutInc * uVar5) / 100 + uVar5;
    local_16c = local_16c + 1;
    if (local_16c == 1000) {
LAB_005b80b1:
      if (vOutMap->pArray != (int *)0x0) {
        free(vOutMap->pArray);
      }
      free(vOutMap);
      if (pPars->fVerbose != 0) {
        uVar5 = Gia_ManCountConst0Pos(p);
        printf("The number of POs proved UNSAT by synthesis = %d.\n",(ulong)uVar5);
      }
      if (pPars->fDumpFinal != 0) {
        pcVar10 = Extra_FileNameGenericAppend(p->pName,"_out.aig");
        Ioa_WriteAiger(p,pcVar10,0,0);
        printf("Final AIG was dumped into file \"%s\".\n",pcVar10);
      }
      Aig_ManStop(p);
      return vCexesOut;
    }
  }
  iVar4 = clock_gettime(3,&local_138);
  if (iVar4 < 0) {
    lVar17 = -1;
  }
  else {
    lVar17 = local_138.tv_nsec / 1000 + local_138.tv_sec * 1000000;
  }
  if ((long)(int)uVar5 * 1000000 + lVar17 <= lVar13) goto LAB_005b7e55;
LAB_005b8094:
  uVar1 = pPars->TimeOutGlo;
  pcVar10 = "Global timeout (%d sec) is reached.\n";
LAB_005b80a7:
  printf(pcVar10,(ulong)uVar1);
  goto LAB_005b80b1;
}

Assistant:

Vec_Ptr_t * Gia_ManMultiProveAig( Aig_Man_t * p, Bmc_MulPar_t * pPars )
{
    Ssw_RarPars_t ParsSim, * pParsSim = &ParsSim;
    Saig_ParBmc_t ParsBmc, * pParsBmc = &ParsBmc;
    Vec_Int_t * vOutMap, * vLeftOver;
    Vec_Ptr_t * vCexes;
    Aig_Man_t * pTemp;
    abctime clkStart = Abc_Clock();
    abctime nTimeToStop = pPars->TimeOutGlo ? Abc_Clock() + pPars->TimeOutGlo * CLOCKS_PER_SEC : 0;
    int nTotalPo     = Saig_ManPoNum(p);
    int nTotalSize   = Aig_ManObjNum(p);
    int TimeOutLoc   = pPars->TimeOutLoc;
    int i, RetValue  = -1;
    if ( pPars->fVerbose )
        printf( "MultiProve parameters: Global timeout = %d sec.  Local timeout = %d sec.  Time increase = %d %%.\n", 
            pPars->TimeOutGlo, pPars->TimeOutLoc, pPars->TimeOutInc );
    if ( pPars->fVerbose )
        printf( "Gap timout = %d sec. Per-output timeout = %d msec. Use synthesis = %d. Dump final = %d. Verbose = %d.\n", 
            pPars->TimeOutGap, pPars->TimePerOut, pPars->fUseSyn, pPars->fDumpFinal, pPars->fVerbose );
    // create output map
    vOutMap = Vec_IntStartNatural( Saig_ManPoNum(p) ); // maps current outputs into their original IDs
    vCexes  = Vec_PtrStart( Saig_ManPoNum(p) );        // maps solved outputs into their CEXes (or markers)
    for ( i = 0; i < 1000; i++ )
    {
        int nSolved = Vec_PtrCountZero(vCexes);
        // perform SIM3
        Ssw_RarSetDefaultParams( pParsSim );
        pParsSim->fSolveAll = 1;
        pParsSim->fNotVerbose = 1;
        pParsSim->fSilent = !pPars->fVeryVerbose;
        pParsSim->TimeOut = TimeOutLoc;
        pParsSim->nRandSeed = (i * 17) % 500;
        pParsSim->nWords = 5;
        RetValue *= Ssw_RarSimulate( p, pParsSim );
        // sort outputs
        if ( p->vSeqModelVec )
        {
            vLeftOver = Gia_ManProcessOutputs( p->vSeqModelVec, vCexes, vOutMap );
            if ( Vec_IntSize(vLeftOver) == 0 )
                break;
            // remove solved        
            p = Saig_ManDupCones( pTemp = p, Vec_IntArray(vLeftOver), Vec_IntSize(vLeftOver) );
            Vec_IntFree( vLeftOver );
            Aig_ManStop( pTemp );
        }
        if ( pPars->fVerbose )
            Gia_ManMultiReport( p, "SIM", nTotalPo, nTotalSize, clkStart );

        // check timeout
        if ( nTimeToStop && Abc_Clock() + TimeOutLoc * CLOCKS_PER_SEC > nTimeToStop )
        {
            printf( "Global timeout (%d sec) is reached.\n", pPars->TimeOutGlo );
            break;
        }

        // perform BMC
        Saig_ParBmcSetDefaultParams( pParsBmc );
        pParsBmc->fSolveAll = 1;
        pParsBmc->fNotVerbose = 1;
        pParsBmc->fSilent = !pPars->fVeryVerbose;
        pParsBmc->nTimeOut = TimeOutLoc;
        pParsBmc->nTimeOutOne = pPars->TimePerOut;
        RetValue *= Saig_ManBmcScalable( p, pParsBmc );
        if ( pPars->fVeryVerbose )
            Abc_Print( 1, "Some outputs are SAT (%d out of %d) after %d frames.\n", 
                Saig_ManPoNum(p) - Vec_PtrCountZero(p->vSeqModelVec), Saig_ManPoNum(p), pParsBmc->iFrame );
        // sort outputs
        if ( p->vSeqModelVec )
        {
            vLeftOver = Gia_ManProcessOutputs( p->vSeqModelVec, vCexes, vOutMap );
            if ( Vec_IntSize(vLeftOver) == 0 )
                break;
            // remove solved        
            p = Saig_ManDupCones( pTemp = p, Vec_IntArray(vLeftOver), Vec_IntSize(vLeftOver) );
            Vec_IntFree( vLeftOver );
            Aig_ManStop( pTemp );
        }
        if ( pPars->fVerbose )
            Gia_ManMultiReport( p, "BMC", nTotalPo, nTotalSize, clkStart );

        // check timeout
        if ( nTimeToStop && Abc_Clock() + TimeOutLoc * CLOCKS_PER_SEC > nTimeToStop )
        {
            printf( "Global timeout (%d sec) is reached.\n", pPars->TimeOutGlo );
            break;
        }

        // check gap timeout
        if ( pPars->TimeOutGap && pPars->TimeOutGap <= TimeOutLoc && nSolved == Vec_PtrCountZero(vCexes) )
        {
            printf( "Gap timeout (%d sec) is reached.\n", pPars->TimeOutGap );
            break;
        }

        // synthesize
        if ( pPars->fUseSyn )
        {
            p = Gia_ManMultiProveSyn( pTemp = p, pPars->fVerbose, pPars->fVeryVerbose );
            Aig_ManStop( pTemp );
            if ( pPars->fVerbose )
                Gia_ManMultiReport( p, "SYN", nTotalPo, nTotalSize, clkStart );
        }

        // increase timeout
        TimeOutLoc += TimeOutLoc * pPars->TimeOutInc / 100;
    }
    Vec_IntFree( vOutMap );
    if ( pPars->fVerbose )
        printf( "The number of POs proved UNSAT by synthesis = %d.\n", Gia_ManCountConst0Pos(p) );
    if ( pPars->fDumpFinal )
    {
        char * pFileName = Extra_FileNameGenericAppend( p->pName, "_out.aig" );
        Ioa_WriteAiger( p, pFileName, 0, 0 );
        printf( "Final AIG was dumped into file \"%s\".\n", pFileName );
    }
    Aig_ManStop( p );
    return vCexes;
}